

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O3

uint __thiscall
Js::WebAssemblyModule::AddGlobalByteSizeToOffset
          (WebAssemblyModule *this,WasmType type,uint32 offset)

{
  uint32 uVar1;
  uint uVar2;
  
  uVar1 = Wasm::WasmTypes::GetTypeByteSize(type);
  uVar2 = -uVar1 & (offset + uVar1) - 1;
  if (offset <= uVar2) {
    uVar1 = WAsmJs::ConvertOffset(this->m_globalCounts[type],uVar1,1);
    if (!CARRY4(uVar1,uVar2)) {
      return uVar1 + uVar2;
    }
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

uint
WebAssemblyModule::AddGlobalByteSizeToOffset(Wasm::WasmTypes::WasmType type, uint32 offset) const
{
    uint32 typeSize = Wasm::WasmTypes::GetTypeByteSize(type);
    offset = ::Math::AlignOverflowCheck(offset, typeSize);
    uint32 sizeUsed = WAsmJs::ConvertOffset<byte>(m_globalCounts[type], typeSize);
    return UInt32Math::Add(offset, sizeUsed);
}